

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

int __thiscall
SID::clock_resample_interpolate(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  int iVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  short *psVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  
  uVar12 = this->sample_offset;
  iVar1 = 0;
  do {
    uVar15 = this->cycles_per_sample + uVar12;
    iVar14 = (int)uVar15 >> 0x10;
    iVar10 = *delta_t;
    if (iVar10 < iVar14) goto LAB_0016a5cc;
    if (n <= iVar1) {
      return iVar1;
    }
    iVar7 = iVar14;
    if (iVar14 < 1) {
      psVar6 = this->sample;
      iVar7 = iVar10;
    }
    else {
      do {
        clock(this);
        iVar2 = (this->extfilt).Vo;
        lVar3 = (long)iVar2;
        sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar2 >> 0x1f);
        if (lVar3 < -0x5800a) {
          sVar4 = -0x8000;
        }
        if (0x57fff < lVar3) {
          sVar4 = 0x7fff;
        }
        psVar6 = this->sample;
        iVar2 = this->sample_index;
        psVar6[(long)iVar2 + 0x4000] = sVar4;
        psVar6[iVar2] = sVar4;
        this->sample_index = iVar2 + 1U & 0x3fff;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      iVar7 = *delta_t;
    }
    *delta_t = iVar7 - iVar14;
    uVar12 = uVar15 & 0xffff;
    this->sample_offset = uVar12;
    iVar7 = this->fir_RES;
    iVar2 = this->fir_N;
    lVar3 = (long)iVar2;
    if (lVar3 < 1) {
      iVar5 = 0;
      iVar11 = 0;
    }
    else {
      iVar13 = (int)(iVar7 * uVar12) >> 0x10;
      lVar9 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + (int)this->fir[iVar2 * iVar13 + lVar9] *
                        (int)psVar6[(long)this->sample_index + ((lVar9 + 0x4000) - lVar3)];
        lVar9 = lVar9 + 1;
      } while (lVar3 != lVar9);
      iVar13 = iVar13 + 1;
      iVar11 = 0;
      iVar8 = iVar13;
      if (iVar13 == iVar7) {
        iVar8 = iVar11;
      }
      if (0 < iVar2) {
        lVar9 = 0;
        iVar11 = 0;
        do {
          iVar11 = iVar11 + (int)this->fir[iVar8 * iVar2 + lVar9] *
                            (int)psVar6[(long)this->sample_index +
                                        (((ulong)(iVar13 != iVar7) + lVar9 + 0x3fff) - lVar3)];
          lVar9 = lVar9 + 1;
        } while (lVar3 != lVar9);
      }
    }
    iVar7 = ((int)((iVar11 - iVar5) * (iVar7 * uVar12 & 0xffff)) >> 0x10) + iVar5 >> 0xf;
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    iVar2 = iVar1 + 1;
    buf[iVar1 * interleave] = (short)iVar7;
    iVar1 = iVar2;
  } while (iVar14 <= iVar10);
  iVar10 = *delta_t;
LAB_0016a5cc:
  if (0 < iVar10) {
    iVar14 = 0;
    do {
      clock(this);
      iVar10 = (this->extfilt).Vo;
      lVar3 = (long)iVar10;
      sVar4 = (short)(uint)((ulong)(lVar3 * 0x2e8ba2e9) >> 0x21) - (short)(iVar10 >> 0x1f);
      if (lVar3 < -0x5800a) {
        sVar4 = -0x8000;
      }
      if (0x57fff < lVar3) {
        sVar4 = 0x7fff;
      }
      psVar6 = this->sample;
      iVar10 = this->sample_index;
      psVar6[(long)iVar10 + 0x4000] = sVar4;
      psVar6[iVar10] = sVar4;
      this->sample_index = iVar10 + 1U & 0x3fff;
      iVar14 = iVar14 + 1;
      iVar10 = *delta_t;
    } while (iVar14 < iVar10);
    uVar12 = this->sample_offset;
  }
  this->sample_offset = uVar12 + iVar10 * -0x10000;
  *delta_t = 0;
  return iVar1;
}

Assistant:

RESID_INLINE
int SID::clock_resample_interpolate(cycle_count& delta_t, short* buf, int n,
				    int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    int fir_offset_rmd = sample_offset*fir_RES & FIXP_MASK;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v1 = 0;
    for (int j = 0; j < fir_N; j++) {
      v1 += sample_start[j]*fir_start[j];
    }

    // Use next FIR table, wrap around to first FIR table using
    // previous sample.
    if (++fir_offset == fir_RES) {
      fir_offset = 0;
      --sample_start;
    }
    fir_start = fir + fir_offset*fir_N;

    // Convolution with filter impulse response.
    int v2 = 0;
    for (int j = 0; j < fir_N; j++) {
      v2 += sample_start[j]*fir_start[j];
    }

    // Linear interpolation.
    // fir_offset_rmd is equal for all samples, it can thus be factorized out:
    // sum(v1 + rmd*(v2 - v1)) = sum(v1) + rmd*(sum(v2) - sum(v1))
    int v = v1 + (fir_offset_rmd*(v2 - v1) >> FIXP_SHIFT);

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}